

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O2

LY_ERR lydjson_subtree_r(lyd_json_ctx *lydctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  ushort uVar1;
  lysc_node *plVar2;
  lyd_node *plVar3;
  lyd_json_ctx *plVar4;
  ly_bool is_attr_00;
  lysc_node *scnode;
  size_t sVar5;
  ulong uVar6;
  LY_ERR LVar7;
  int iVar8;
  LY_ERR LVar9;
  uint uVar10;
  LYJSON_PARSER_STATUS LVar11;
  ly_err_item *plVar12;
  lyd_node *plVar13;
  char *pcVar14;
  lysc_node *plVar15;
  lysc_node **pplVar16;
  char *pcVar17;
  lys_module *mod;
  size_t sVar18;
  lyd_json_ctx *plVar19;
  char cVar20;
  uint16_t uVar21;
  uint uVar22;
  lyjson_ctx *plVar23;
  lyd_node *plVar24;
  char *pcVar25;
  LY_ERR ret__;
  ulong uVar26;
  lyd_node **first_p_00;
  ly_ctx *plVar27;
  bool bVar28;
  LYJSON_PARSER_STATUS status_1;
  lyd_node **local_158;
  LYJSON_PARSER_STATUS status;
  lyd_json_ctx *local_148;
  ly_bool is_attr;
  uint local_138;
  ly_bool is_meta;
  ulong local_130;
  lyd_node *local_128;
  lyd_node *node;
  undefined4 local_114;
  char *local_110;
  lysc_node *snode;
  uint local_fc;
  char *prefix;
  ly_ctx *local_f0;
  char *name;
  lyd_node *local_e0;
  lysc_ext_instance *ext;
  size_t local_d0;
  char *local_c8;
  uint32_t val_hints;
  lysc_node *local_b8;
  ly_ctx *local_b0;
  char *name_1;
  char *local_a0;
  uint local_94;
  lyd_node *local_90;
  char *value;
  size_t prefix_len_1;
  char *dynamic_prefname;
  char *prefix_1;
  lyd_meta **local_68;
  ly_set *local_60;
  size_t prefix_len;
  size_t local_50;
  char *module_name;
  size_t name_len_1;
  size_t name_len;
  
  status = lyjson_ctx_status(lydctx->jsonctx);
  prefix = (char *)0x0;
  prefix_len = 0;
  snode = (lysc_node *)0x0;
  is_meta = '\0';
  ext = (lysc_ext_instance *)0x0;
  node = (lyd_node *)0x0;
  local_b0 = lydctx->jsonctx->ctx;
  value = (char *)0x0;
  if (parent == (lyd_node *)0x0 && first_p == (lyd_node **)0x0) {
    __assert_fail("parent || first_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x630,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  if (1 < status - LYJSON_OBJECT) {
    __assert_fail("(status == LYJSON_OBJECT) || (status == LYJSON_OBJECT_NEXT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x631,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  uVar10 = lydctx->parse_opts;
  lydctx->parse_opts = uVar10 & 0xffbfffff;
  LVar7 = lyjson_ctx_next(lydctx->jsonctx,&status);
  uVar6 = local_130;
  if ((LVar7 != LY_SUCCESS) ||
     (LVar7 = LY_SUCCESS, local_148 = lydctx, status == LYJSON_OBJECT_CLOSED)) goto LAB_00132e58;
  local_158 = first_p;
  local_94 = uVar10;
  local_60 = parsed;
  if (status != LYJSON_OBJECT_NAME) {
    __assert_fail("status == LYJSON_OBJECT_NAME",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x63f,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  local_128 = parent;
  lydjson_parse_name(lydctx->jsonctx->value,lydctx->jsonctx->value_len,&name,&name_len,&prefix,
                     &prefix_len,&is_meta);
  lyjson_ctx_give_dynamic_value(lydctx->jsonctx,&value);
  sVar18 = prefix_len;
  pcVar14 = name;
  is_attr_00 = is_meta;
  if ((prefix_len == 0 &&
       ((name_len != 0 && (lydctx->int_opts & 0x80) != 0) &&
       (is_meta == '\0' && parent == (lyd_node *)0x0))) &&
     (iVar8 = ly_strncmp("eventTime",name,name_len), plVar19 = local_148, iVar8 == 0)) {
    LVar7 = lyjson_ctx_next(local_148->jsonctx,&status);
    uVar6 = local_130;
    if (LVar7 != LY_SUCCESS) goto LAB_00132e58;
    plVar23 = plVar19->jsonctx;
    plVar27 = plVar23->ctx;
    if (status != LYJSON_STRING) {
      pcVar14 = lyjson_token2str(LYJSON_STRING);
      pcVar17 = lyjson_token2str(status);
      ly_vlog(plVar27,(char *)0x0,LYVE_SYNTAX_JSON,"Expecting JSON %s but %s found.",pcVar14,pcVar17
             );
      LVar7 = LY_EVALID;
      uVar6 = local_130;
      goto LAB_00132e58;
    }
    LVar7 = lyd_create_opaq(plVar27,pcVar14,name_len,prefix,0,prefix,0,plVar23->value,
                            plVar23->value_len,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,1,&node);
    uVar6 = local_130;
    if (LVar7 != LY_SUCCESS) goto LAB_00132e58;
    local_130 = 0;
    LVar7 = lyd_parser_notif_eventtime_validate(node);
    first_p_00 = local_158;
joined_r0x00132cc1:
    uVar6 = local_130;
    if (LVar7 != LY_SUCCESS) goto LAB_00132e58;
  }
  else {
    if ((sVar18 == 0 && name_len == 0) && is_attr_00 != '\0') {
LAB_0013278b:
      if ((sVar18 == 0 && name_len == 0) && local_128 == (lyd_node *)0x0) {
        ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_JSON,
                "Invalid metadata format - \"@\" can be used only inside anydata, container or list entries."
               );
        plVar19 = local_148;
        plVar12 = ly_err_last(local_148->jsonctx->ctx);
        uVar26 = 7;
        LVar7 = LY_EVALID;
        uVar6 = local_130;
        if (((plVar19->val_opts & 4) == 0) || (plVar12->vecode == LYVE_SYNTAX)) goto LAB_00132e58;
LAB_00132803:
        plVar13 = (lyd_node *)0x0;
        local_130 = uVar26;
      }
      else {
        uVar26 = 0;
        if (sVar18 != 0 || name_len != 0) goto LAB_00132803;
        snode = local_128->schema;
        local_130 = 0;
        plVar13 = local_128;
      }
      scnode = snode;
      local_c8 = prefix;
      local_d0 = sVar18;
      plVar15 = snode;
      if (prefix == (char *)0x0 && snode == (lysc_node *)0x0) {
        if (local_128 != (lyd_node *)0x0) {
          plVar15 = (lysc_node *)&local_c8;
          lydjson_get_node_prefix(local_128,(char *)0x0,0,(char **)plVar15,&local_d0);
          goto LAB_00132868;
        }
        local_c8 = "";
        local_d0 = 0;
        if (plVar13 == (lyd_node *)0x0) {
LAB_001329d1:
          plVar13 = *local_158;
          goto LAB_00132abe;
        }
      }
      else {
LAB_00132868:
        if (plVar13 == (lyd_node *)0x0) {
          if (local_128 == (lyd_node *)0x0) goto LAB_001329d1;
          plVar13 = lyd_child(local_128);
LAB_00132abe:
          for (; plVar19 = local_148, first_p_00 = local_158, plVar13 != (lyd_node *)0x0;
              plVar13 = plVar13->next) {
            plVar2 = plVar13->schema;
            if (scnode == (lysc_node *)0x0) {
              if (plVar2 == (lysc_node *)0x0) {
                plVar24 = plVar13[1].next;
                iVar8 = ly_strncmp((char *)plVar13[1].schema,name,name_len);
                plVar15 = (lysc_node *)((ulong)plVar15 & 0xffffffffffffff00);
                if (plVar24 != (lyd_node *)0x0 && iVar8 == 0) goto LAB_00132aaa;
              }
              else {
                iVar8 = ly_strncmp(plVar2->name,name,name_len);
                if (iVar8 == 0) {
                  plVar24 = (lyd_node *)plVar13->schema->module->name;
LAB_00132aaa:
                  iVar8 = ly_strncmp((char *)plVar24,local_c8,local_d0);
                  goto LAB_00132aaf;
                }
              }
            }
            else if (plVar2 == (lysc_node *)0x0) {
              plVar24 = plVar13[1].next;
              iVar8 = strcmp((char *)plVar13[1].schema,scnode->name);
              plVar15 = (lysc_node *)((ulong)plVar15 & 0xffffffffffffff00);
              if (plVar24 != (lyd_node *)0x0 && iVar8 == 0) {
                iVar8 = strcmp((char *)plVar24,scnode->module->name);
LAB_00132aaf:
                if (iVar8 == 0) goto LAB_0013286d;
              }
            }
            else if (plVar2 == scnode) goto LAB_0013286d;
          }
          uVar10 = local_148->parse_opts;
          local_148->parse_opts = uVar10 & 0xfff9ffff | 0x40000;
          if (local_c8 != (char *)0x0) {
            name = local_c8;
          }
          sVar18 = name_len + 2 + local_d0;
          if (local_c8 == (char *)0x0) {
            sVar18 = name_len + 1;
          }
          LVar7 = lydjson_ctx_next_parse_opaq
                            (local_148,name + -1,sVar18,(char *)0x0,0,local_128,&status,local_158,
                             &node);
          plVar19->parse_opts = uVar10;
          goto joined_r0x00132cc1;
        }
      }
LAB_0013286d:
      plVar19 = local_148;
      prefix_1 = (char *)0x0;
      dynamic_prefname = (char *)0x0;
      prefix_len_1 = 0;
      plVar23 = local_148->jsonctx;
      plVar27 = plVar23->ctx;
      is_attr = '\0';
      if (scnode == (lysc_node *)0x0) {
        local_110 = (char *)CONCAT62(local_110._2_6_,1);
      }
      else {
        local_110 = (char *)CONCAT62(local_110._2_6_,scnode->nodetype);
        plVar15 = (lysc_node *)0x0;
        ly_log_location(scnode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
        plVar23 = plVar19->jsonctx;
      }
      first_p_00 = local_158;
      LVar7 = lyjson_ctx_next(plVar23,&status_1);
      local_b0 = (ly_ctx *)scnode;
      if (LVar7 == LY_SUCCESS) {
        plVar24 = plVar13;
        uVar21 = (ushort)local_110;
        local_f0 = plVar27;
        if ((ushort)local_110 == 1) {
LAB_00132b44:
          local_a0 = "@/object";
          local_114 = (undefined4)CONCAT71((int7)((ulong)plVar15 >> 8),1);
          cVar20 = '\x01';
LAB_00132cf2:
          uVar10 = 0;
          uVar22 = (uint)(ushort)local_110;
          if (status_1 == LYJSON_OBJECT) goto LAB_0013334c;
        }
        else {
          if ((ushort)local_110 == 4) {
LAB_00132ccc:
            local_a0 = "@name/object";
            local_114 = 0;
            cVar20 = '\0';
            goto LAB_00132cf2;
          }
          if (((ushort)local_110 == 0x400) || ((ushort)local_110 == 0x10)) goto LAB_00132b44;
          if ((ushort)local_110 == 0x20) goto LAB_00132ccc;
          if ((((ushort)local_110 == 0x60) || ((ushort)local_110 == 0x100)) ||
             ((ushort)local_110 == 0x200)) goto LAB_00132b44;
          if ((ushort)local_110 != 8) {
            LVar7 = LY_EINT;
            ly_log(plVar27,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                   ,0x322);
            goto LAB_00132da6;
          }
          local_114 = 0;
          local_a0 = "@name/array of objects/nulls";
          if (status_1 == LYJSON_ARRAY) {
            local_fc = 0;
            uVar10 = (uint)(ushort)local_110;
            LVar11 = LYJSON_ARRAY;
            do {
              plVar27 = local_f0;
              if (LVar11 == LYJSON_ARRAY_CLOSED) {
LAB_001337b5:
                LVar7 = LY_SUCCESS;
                first_p_00 = local_158;
                goto LAB_00132da6;
              }
              local_138 = uVar10;
              LVar7 = lyjson_ctx_next(plVar19->jsonctx,&status_1);
              first_p_00 = local_158;
              if (LVar7 != LY_SUCCESS) break;
              uVar10 = local_fc + 1;
              local_fc = uVar10;
              if ((status_1 != LYJSON_NULL) && (status_1 != LYJSON_OBJECT)) {
                cVar20 = (char)local_114;
                uVar21 = (uint16_t)local_138;
                goto LAB_00132cfb;
              }
              if (plVar13 == (lyd_node *)0x0) {
                plVar15 = plVar24->schema;
LAB_001337c7:
                ly_vlog(plVar19->jsonctx->ctx,(char *)0x0,LYVE_REFERENCE,
                        "Missing JSON data instance #%u of %s:%s to be coupled with metadata.",
                        (ulong)uVar10,plVar15->module->name,plVar15->name);
                first_p_00 = local_158;
                goto LAB_00132d84;
              }
              plVar15 = plVar24->schema;
              if (plVar13->schema != plVar15) goto LAB_001337c7;
              uVar22 = local_138;
              if (status_1 == LYJSON_OBJECT) {
LAB_0013334c:
                local_68 = &plVar13->meta;
                local_138 = uVar22;
                local_fc = uVar10;
                local_e0 = plVar13;
                local_90 = plVar24;
                do {
                  LVar7 = lyjson_ctx_next(plVar19->jsonctx,&status_1);
                  if (LVar7 != LY_SUCCESS) goto LAB_00132907;
                  if (status_1 != LYJSON_OBJECT_NAME) {
                    cVar20 = (char)local_114;
                    plVar24 = local_90;
                    plVar13 = local_e0;
                    uVar21 = (uint16_t)local_138;
                    goto LAB_00132cfb;
                  }
                  lydjson_parse_name(plVar19->jsonctx->value,plVar19->jsonctx->value_len,&name_1,
                                     &name_len_1,&prefix_1,&prefix_len_1,&is_attr);
                  lyjson_ctx_give_dynamic_value(plVar19->jsonctx,&dynamic_prefname);
                  sVar5 = name_len_1;
                  pcVar14 = prefix_1;
                  sVar18 = prefix_len_1;
                  plVar4 = local_148;
                  if (name_len_1 == 0) {
                    ly_vlog(plVar27,(char *)0x0,LYVE_SYNTAX_JSON,
                            "Metadata in JSON found with an empty name, followed by: %.10s",name_1);
                    goto LAB_00132d84;
                  }
                  if (prefix_len_1 == 0) {
                    uVar10 = (uint)local_148->jsonctx->value_len;
                    pcVar14 = local_148->jsonctx->value;
                    pcVar17 = 
                    "Metadata in JSON must be namespace-qualified, missing prefix for \"%.*s\".";
LAB_00133747:
                    ly_vlog(plVar27,(char *)0x0,LYVE_SYNTAX_JSON,pcVar17,(ulong)uVar10,pcVar14);
                    plVar19 = plVar4;
                    goto LAB_00132d84;
                  }
                  if (is_attr != '\0') {
                    uVar10 = (uint)local_148->jsonctx->value_len;
                    pcVar14 = local_148->jsonctx->value;
                    pcVar17 = 
                    "Invalid format of the Metadata identifier in JSON, unexpected \'@\' in \"%.*s\""
                    ;
                    goto LAB_00133747;
                  }
                  mod = ly_ctx_get_module_implemented2(plVar27,prefix_1,prefix_len_1);
                  plVar19 = local_148;
                  if (mod == (lys_module *)0x0) {
                    if ((local_148->parse_opts >> 0x11 & 1) != 0) {
                      ly_vlog(local_f0,(char *)0x0,LYVE_REFERENCE,
                              "Prefix \"%.*s\" of the metadata \"%.*s\" does not match any module in the context."
                              ,sVar18 & 0xffffffff,pcVar14,sVar5,name_1);
                      plVar19 = local_148;
                      first_p_00 = local_158;
                      goto LAB_00132d84;
                    }
                    if (local_e0->schema == (lysc_node *)0x0) {
                      if ((local_148->parse_opts >> 0x12 & 1) == 0) {
                        __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                                      ,0x350,
                                      "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                                     );
                      }
                      goto LAB_0013343a;
                    }
                    LVar7 = lydjson_data_skip(local_148->jsonctx);
                    first_p_00 = local_158;
                    if (LVar7 != LY_SUCCESS) goto LAB_00132907;
                    status_1 = lyjson_ctx_status(plVar19->jsonctx);
                    first_p_00 = local_158;
                  }
                  else {
LAB_0013343a:
                    local_b8 = (lysc_node *)sVar5;
                    LVar7 = lyjson_ctx_next(local_148->jsonctx,&status_1);
                    first_p_00 = local_158;
                    if ((LVar7 != LY_SUCCESS) ||
                       (LVar7 = lydjson_value_type_hint(plVar19->jsonctx,&status_1,&val_hints),
                       plVar13 = local_e0, plVar19 = local_148, first_p_00 = local_158,
                       LVar7 != LY_SUCCESS)) goto LAB_00132907;
                    if (local_e0->schema == (lysc_node *)0x0) {
                      lydjson_get_node_prefix(local_e0,pcVar14,sVar18,&module_name,&local_50);
                      plVar19 = local_148;
                      plVar23 = local_148->jsonctx;
                      LVar7 = lyd_create_attr(plVar13,(lyd_attr **)0x0,plVar23->ctx,name_1,
                                              (size_t)local_b8,pcVar14,sVar18,module_name,local_50,
                                              plVar23->value,plVar23->value_len,&plVar23->dynamic,
                                              LY_VALUE_JSON,(void *)0x0,val_hints);
                    }
                    else {
                      plVar23 = local_148->jsonctx;
                      LVar7 = lyd_parser_create_meta
                                        ((lyd_ctx *)local_148,local_e0,(lyd_meta **)0x0,mod,name_1,
                                         (size_t)local_b8,plVar23->value,plVar23->value_len,
                                         &plVar23->dynamic,LY_VALUE_JSON,(void *)0x0,val_hints,
                                         local_e0->schema);
                      first_p_00 = local_158;
                      if (LVar7 != LY_SUCCESS) goto LAB_00132907;
                      LVar7 = lyd_parser_set_data_flags
                                        (plVar13,local_68,(lyd_ctx *)plVar19,
                                         (lysc_ext_instance *)0x0);
                    }
                    first_p_00 = local_158;
                    if ((LVar7 != LY_SUCCESS) ||
                       (LVar7 = lyjson_ctx_next(plVar19->jsonctx,&status_1), plVar19 = local_148,
                       LVar7 != LY_SUCCESS)) goto LAB_00132907;
                  }
                  plVar19 = local_148;
                  plVar27 = local_f0;
                } while (status_1 == LYJSON_OBJECT_NEXT);
                if (status_1 != LYJSON_OBJECT_CLOSED) {
                  cVar20 = (char)local_114;
                  plVar24 = local_90;
                  plVar13 = local_e0;
                  uVar21 = (uint16_t)local_138;
                  goto LAB_00132cfb;
                }
                if ((ushort)local_110 != 8) goto LAB_001337b5;
                plVar3 = local_e0->next;
                LVar7 = lyjson_ctx_next(local_148->jsonctx,&status_1);
                plVar24 = local_e0;
              }
              else {
                if (status_1 != LYJSON_NULL) {
                  __assert_fail("status == LYJSON_OBJECT",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                                ,0x328,
                                "LY_ERR lydjson_metadata(struct lyd_json_ctx *, const struct lysc_node *, struct lyd_node *)"
                               );
                }
                plVar3 = plVar13->next;
                LVar7 = lyjson_ctx_next(plVar19->jsonctx,&status_1);
                plVar24 = plVar13;
              }
              plVar13 = plVar3;
              first_p_00 = local_158;
              uVar10 = local_138;
              LVar11 = status_1;
            } while (LVar7 == LY_SUCCESS);
            goto LAB_00132907;
          }
          cVar20 = '\0';
        }
LAB_00132cfb:
        pcVar14 = lys_nodetype2str(uVar21);
        if (plVar13 == (lyd_node *)0x0) {
          plVar15 = plVar24->schema;
          if (plVar15 != (lysc_node *)0x0) goto LAB_00132d28;
          pplVar16 = &plVar24[1].schema;
        }
        else {
          plVar15 = plVar13->schema;
          if (plVar15 == (lysc_node *)0x0) {
            pplVar16 = &plVar13[1].schema;
          }
          else {
LAB_00132d28:
            pplVar16 = (lysc_node **)&plVar15->name;
          }
        }
        plVar15 = *pplVar16;
        pcVar17 = lyjson_token2str(status_1);
        pcVar25 = "";
        if (cVar20 == '\0') {
          pcVar25 = "name";
        }
        ly_vlog(local_f0,(char *)0x0,LYVE_SYNTAX_JSON,
                "The attribute(s) of %s \"%s\" is expected to be represented as JSON %s, but input data contains @%s/%s."
                ,pcVar14,plVar15,local_a0,pcVar17,pcVar25);
LAB_00132d84:
        if ((plVar19->val_opts & 4) == 0) {
          LVar7 = LY_EVALID;
        }
        else {
          LVar9 = lydjson_data_skip(plVar19->jsonctx);
          LVar7 = LY_EVALID;
          if (LVar9 != LY_SUCCESS) {
            LVar7 = LVar9;
          }
        }
      }
      else {
LAB_00132907:
        if (LVar7 == LY_EVALID) goto LAB_00132d84;
      }
LAB_00132da6:
      bVar28 = local_b0 != (ly_ctx *)0x0;
      free(dynamic_prefname);
      ly_log_location_revert((uint)bVar28,0,0,0);
      goto joined_r0x00132cc1;
    }
    LVar9 = lydjson_get_snode(local_148,is_attr_00,prefix,sVar18,name,name_len,local_128,&snode,&ext
                             );
    plVar19 = local_148;
    first_p_00 = local_158;
    if (LVar9 != LY_SUCCESS) {
      LVar7 = LY_SUCCESS;
      uVar6 = local_130;
      if (((LVar9 == LY_ENOT) || (LVar7 = LVar9, LVar9 != LY_EVALID)) ||
         ((local_148->val_opts & 4) == 0)) goto LAB_00132e58;
      LVar9 = lydjson_data_skip(local_148->jsonctx);
      LVar7 = LY_EVALID;
      if (LVar9 != LY_SUCCESS) {
        LVar7 = LVar9;
      }
      LVar9 = lyjson_ctx_next(plVar19->jsonctx,&status);
LAB_001326b5:
      uVar6 = local_130;
      if (LVar9 != LY_SUCCESS) {
        LVar7 = LVar9;
      }
      goto LAB_00132e58;
    }
    if (snode == (lysc_node *)0x0) {
LAB_00132c3c:
      if ((local_148->parse_opts & 0x40000) != 0) {
        local_130 = 0;
        if (name_len == 0) {
          ly_vlog(local_148->jsonctx->ctx,(char *)0x0,LYVE_SYNTAX_JSON,
                  "JSON object member name cannot be a zero-length string.");
          plVar12 = ly_err_last(plVar19->jsonctx->ctx);
          LVar7 = LY_EVALID;
          uVar6 = local_130;
          if ((plVar19->val_opts & 4) == 0) goto LAB_00132e58;
          local_130 = 7;
          LVar7 = LY_EVALID;
          uVar6 = local_130;
          local_130 = 7;
          if (plVar12->vecode == LYVE_SYNTAX) goto LAB_00132e58;
        }
        plVar19 = local_148;
        LVar7 = lydjson_ctx_next_parse_opaq
                          (local_148,name,name_len,prefix,sVar18,local_128,&status,first_p_00,&node)
        ;
        goto joined_r0x00132cc1;
      }
      LVar7 = lydjson_data_skip(local_148->jsonctx);
      uVar6 = local_130;
      if (LVar7 != LY_SUCCESS) goto LAB_00132e58;
LAB_00132c64:
      local_130 = 0;
      first_p_00 = local_158;
    }
    else {
      if (is_attr_00 != '\0') goto LAB_0013278b;
      if (snode == (lysc_node *)0x0) goto LAB_00132c3c;
      LVar7 = lyjson_ctx_next(local_148->jsonctx,&status);
      first_p_00 = local_158;
      uVar6 = local_130;
      if (LVar7 != LY_SUCCESS) goto LAB_00132e58;
      uVar1 = snode->nodetype;
      uVar10 = (uint)uVar1;
      if (uVar1 == 1) goto LAB_00132f19;
      if (uVar1 == 4) {
        pcVar14 = "name/[null]";
LAB_001330d4:
        local_110 = "name/value";
        if (status == LYJSON_ARRAY) {
          local_110 = pcVar14;
        }
LAB_001330e9:
        LVar7 = lydjson_parse_instance
                          (plVar19,local_128,local_158,snode,ext,name,name_len,prefix,sVar18,&status
                           ,&node);
        uVar26 = (ulong)LVar7;
        if (LVar7 != LY_SUCCESS) {
          if (LVar7 == LY_ENOT) goto LAB_00133138;
          plVar12 = ly_err_last(plVar19->jsonctx->ctx);
          uVar6 = local_130;
          if ((LVar7 != LY_EVALID) || (LVar7 = LY_EVALID, (local_148->val_opts & 4) == 0))
          goto LAB_00132e58;
          local_130 = 7;
          LVar7 = LY_EVALID;
          uVar6 = local_130;
          uVar26 = 7;
          if (plVar12->vecode == LYVE_SYNTAX) goto LAB_00132e58;
        }
        local_130 = uVar26;
        plVar19 = local_148;
        if ((snode->nodetype & 0x700) != 0) {
          local_148->op_node = node;
        }
      }
      else {
        if (uVar1 != 8) {
          if (uVar1 == 0x400) {
LAB_00132f19:
            local_110 = "name/object";
          }
          else {
            if (uVar1 == 0x20) {
              pcVar14 = "name/array";
              goto LAB_001330d4;
            }
            if (((uVar1 == 0x60) || (uVar1 == 0x100)) || (uVar1 == 0x200)) goto LAB_00132f19;
            if (uVar10 == 0x10) {
              local_110 = "name/array of objects";
              goto LAB_00132fa1;
            }
            local_110 = (char *)0x0;
          }
          if (uVar10 < 0x21) {
            if ((0x100000012U >> ((ulong)uVar10 & 0x3f) & 1) != 0) goto LAB_001330e9;
            if ((0x10100UL >> ((ulong)uVar10 & 0x3f) & 1) != 0) goto LAB_00132fa1;
          }
          if (((uVar10 == 0x60) || (uVar1 == 0x100)) || ((uVar1 == 0x200 || (uVar10 == 0x400))))
          goto LAB_001330e9;
          goto LAB_00132c64;
        }
        local_110 = "name/array of values";
LAB_00132fa1:
        if (status != LYJSON_ARRAY) {
LAB_00133138:
          pcVar17 = lys_nodetype2str(snode->nodetype);
          pcVar14 = snode->name;
          pcVar25 = lyjson_token2str(status);
          ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_JSON,
                  "Expecting JSON %s but %s \"%s\" is represented in input data as name/%s.",
                  local_110,pcVar17,pcVar14,pcVar25);
          LVar7 = LY_EVALID;
          uVar6 = local_130;
          if ((plVar19->val_opts & 4) == 0) goto LAB_00132e58;
          LVar9 = lydjson_data_skip(local_148->jsonctx);
          LVar7 = LY_EVALID;
          goto LAB_001326b5;
        }
        local_f0 = (ly_ctx *)name;
        local_130 = 0;
        local_b8 = (lysc_node *)prefix;
        do {
          LVar7 = lyjson_ctx_next(plVar19->jsonctx,&status);
          uVar6 = local_130;
          if (LVar7 != LY_SUCCESS) goto LAB_00132e58;
          if (status == LYJSON_ARRAY_CLOSED) break;
          LVar7 = lydjson_parse_instance
                            (plVar19,local_128,first_p_00,snode,ext,(char *)local_f0,name_len,
                             (char *)local_b8,sVar18,&status,&node);
          if (LVar7 != LY_SUCCESS) {
            if (LVar7 == LY_ENOT) goto LAB_00133138;
            plVar12 = ly_err_last(plVar19->jsonctx->ctx);
            uVar6 = local_130;
            if ((LVar7 != LY_EVALID) || (LVar7 = LY_EVALID, (plVar19->val_opts & 4) == 0))
            goto LAB_00132e58;
            local_130 = 7;
            uVar6 = 7;
            if (plVar12->vecode == LYVE_SYNTAX) goto LAB_00132e58;
          }
          first_p_00 = local_158;
          lydjson_maintain_children
                    (local_128,local_158,&node,(byte)(plVar19->parse_opts >> 0x15) & 1,ext);
          LVar7 = lyjson_ctx_next(plVar19->jsonctx,&status);
          uVar6 = local_130;
          if (LVar7 != LY_SUCCESS) goto LAB_00132e58;
        } while (status == LYJSON_ARRAY_NEXT);
      }
    }
  }
  if (node != (lyd_node *)0x0 && local_60 != (ly_set *)0x0) {
    ly_set_add(local_60,node,'\x01',(uint32_t *)0x0);
  }
  lydjson_maintain_children(local_128,first_p_00,&node,(byte)(plVar19->parse_opts >> 0x15) & 1,ext);
  if ((local_94 >> 0x16 & 1) == 0) {
    LVar9 = lyjson_ctx_next(plVar19->jsonctx,&status);
    LVar7 = (LY_ERR)local_130;
    uVar6 = local_130;
    if (LVar9 != LY_SUCCESS) {
      LVar7 = LVar9;
    }
  }
  else {
    LVar7 = (LY_ERR)local_130;
    uVar6 = local_130;
  }
LAB_00132e58:
  local_130 = uVar6;
  free(value);
  lyd_free_tree(node);
  return LVar7;
}

Assistant:

static LY_ERR
lydjson_subtree_r(struct lyd_json_ctx *lydctx, struct lyd_node *parent, struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR r, rc = LY_SUCCESS;
    enum LYJSON_PARSER_STATUS status = lyjson_ctx_status(lydctx->jsonctx);
    const char *name, *prefix = NULL, *expected = NULL;
    size_t name_len, prefix_len = 0;
    ly_bool is_meta = 0, parse_subtree;
    const struct lysc_node *snode = NULL;
    struct lysc_ext_instance *ext = NULL;
    struct lyd_node *node = NULL, *attr_node = NULL;
    const struct ly_ctx *ctx = lydctx->jsonctx->ctx;
    char *value = NULL;

    assert(parent || first_p);
    assert((status == LYJSON_OBJECT) || (status == LYJSON_OBJECT_NEXT));

    parse_subtree = lydctx->parse_opts & LYD_PARSE_SUBTREE ? 1 : 0;
    /* all descendants should be parsed */
    lydctx->parse_opts &= ~LYD_PARSE_SUBTREE;

    r = lyjson_ctx_next(lydctx->jsonctx, &status);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    if (status == LYJSON_OBJECT_CLOSED) {
        /* empty object, fine... */
        goto cleanup;
    }

    /* process the node name */
    assert(status == LYJSON_OBJECT_NAME);
    lydjson_parse_name(lydctx->jsonctx->value, lydctx->jsonctx->value_len, &name, &name_len, &prefix, &prefix_len, &is_meta);
    lyjson_ctx_give_dynamic_value(lydctx->jsonctx, &value);

    if ((lydctx->int_opts & LYD_INTOPT_EVENTTIME) && !parent && !is_meta && name_len && !prefix_len &&
            !ly_strncmp("eventTime", name, name_len)) {
        /* parse eventTime */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        if (status != LYJSON_STRING) {
            LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s found.", lyjson_token2str(LYJSON_STRING),
                    lyjson_token2str(status));
            rc = LY_EVALID;
            goto cleanup;
        }

        /* create node */
        r = lyd_create_opaq(lydctx->jsonctx->ctx, name, name_len, prefix, prefix_len, prefix, prefix_len,
                lydctx->jsonctx->value, lydctx->jsonctx->value_len, NULL, LY_VALUE_JSON, NULL, LYD_VALHINT_STRING, &node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        /* validate the value */
        r = lyd_parser_notif_eventtime_validate(node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        goto node_parsed;
    } else if (!is_meta || name_len || prefix_len) {
        /* get the schema node */
        r = lydjson_get_snode(lydctx, is_meta, prefix, prefix_len, name, name_len, parent, &snode, &ext);
        if (r == LY_ENOT) {
            /* data parsed */
            goto cleanup;
        } else if ((r == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
            rc = r;

            /* skip the invalid data */
            if ((r = lydjson_data_skip(lydctx->jsonctx))) {
                rc = r;
            }
            r = lyjson_ctx_next(lydctx->jsonctx, &status);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            goto cleanup;
        } else if (r) {
            /* error */
            rc = r;
            goto cleanup;
        }

        if (!snode) {
            /* we will not be parsing it as metadata */
            is_meta = 0;
        }
    }

    if (is_meta) {
        /* parse as metadata */
        if (!name_len && !prefix_len && !parent) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON,
                    "Invalid metadata format - \"@\" can be used only inside anydata, container or list entries.");
            r = LY_EVALID;
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        } else if (!name_len && !prefix_len) {
            /* parent's metadata without a name - use the schema from the parent */
            attr_node = parent;
            snode = attr_node->schema;
        }
        r = lydjson_parse_attribute(lydctx, attr_node, snode, name, name_len, prefix, prefix_len, parent, &status,
                first_p, &node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    } else if (!snode) {
        if (!(lydctx->parse_opts & LYD_PARSE_OPAQ)) {
            /* skip element with children */
            r = lydjson_data_skip(lydctx->jsonctx);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        } else {
            /* parse as an opaq node */

            /* opaq node cannot have an empty string as the name. */
            if (name_len == 0) {
                LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "JSON object member name cannot be a zero-length string.");
                r = LY_EVALID;
                LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
            }

            /* move to the second item in the name/X pair and parse opaq */
            r = lydjson_ctx_next_parse_opaq(lydctx, name, name_len, prefix, prefix_len, parent, &status, first_p, &node);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }
    } else {
        /* parse as a standard lyd_node but it can still turn out to be an opaque node */

        /* move to the second item in the name/X pair */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        /* set expected representation */
        switch (snode->nodetype) {
        case LYS_LEAFLIST:
            expected = "name/array of values";
            break;
        case LYS_LIST:
            expected = "name/array of objects";
            break;
        case LYS_LEAF:
            if (status == LYJSON_ARRAY) {
                expected = "name/[null]";
            } else {
                expected = "name/value";
            }
            break;
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_ACTION:
        case LYS_RPC:
        case LYS_ANYDATA:
            expected = "name/object";
            break;
        case LYS_ANYXML:
            if (status == LYJSON_ARRAY) {
                expected = "name/array";
            } else {
                expected = "name/value";
            }
            break;
        }

        /* check the representation according to the nodetype and then continue with the content */
        switch (snode->nodetype) {
        case LYS_LEAFLIST:
        case LYS_LIST:
            LY_CHECK_GOTO(status != LYJSON_ARRAY, representation_error);

            /* process all the values/objects */
            do {
                /* move into array/next value */
                r = lyjson_ctx_next(lydctx->jsonctx, &status);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
                if (status == LYJSON_ARRAY_CLOSED) {
                    /* empty array, fine... */
                    break;
                }

                r = lydjson_parse_instance(lydctx, parent, first_p, snode, ext, name, name_len, prefix, prefix_len,
                        &status, &node);
                if (r == LY_ENOT) {
                    goto representation_error;
                }
                LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

                lydjson_maintain_children(parent, first_p, &node,
                        lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT, ext);

                /* move after the item(s) */
                r = lyjson_ctx_next(lydctx->jsonctx, &status);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            } while (status == LYJSON_ARRAY_NEXT);

            break;
        case LYS_LEAF:
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_ACTION:
        case LYS_RPC:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            /* process the value/object */
            r = lydjson_parse_instance(lydctx, parent, first_p, snode, ext, name, name_len, prefix, prefix_len,
                    &status, &node);
            if (r == LY_ENOT) {
                goto representation_error;
            }
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

            if (snode->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)) {
                /* rememeber the RPC/action/notification */
                lydctx->op_node = node;
            }
            break;
        }
    }

node_parsed:
    /* rememeber a successfully parsed node */
    if (parsed && node) {
        ly_set_add(parsed, node, 1, NULL);
    }

    /* finally connect the parsed node, is zeroed */
    lydjson_maintain_children(parent, first_p, &node,
            lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT, ext);

    if (!parse_subtree) {
        /* move after the item(s) */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    }

    /* success */
    goto cleanup;

representation_error:
    LOGVAL(ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s \"%s\" is represented in input data as name/%s.",
            expected, lys_nodetype2str(snode->nodetype), snode->name, lyjson_token2str(status));
    rc = LY_EVALID;
    if (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) {
        /* try to skip the invalid data */
        if ((r = lydjson_data_skip(lydctx->jsonctx))) {
            rc = r;
        }
    }

cleanup:
    free(value);
    lyd_free_tree(node);
    return rc;
}